

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

HMAC_context * Curl_HMAC_init(HMAC_params *hashparams,uchar *key,uint keylen)

{
  uchar *puVar1;
  HMAC_context *pHVar2;
  HMAC_context *pHVar3;
  ulong uVar4;
  ulong uVar5;
  uchar b;
  uchar *local_48;
  HMAC_context *local_40;
  ulong local_38;
  
  local_48 = key;
  pHVar2 = (HMAC_context *)
           (*Curl_cmalloc)((ulong)(hashparams->ctxtsize * 2) + (ulong)hashparams->resultlen + 0x18);
  if (pHVar2 != (HMAC_context *)0x0) {
    pHVar2->hash = hashparams;
    pHVar3 = pHVar2 + 1;
    pHVar2->hashctxt1 = pHVar3;
    pHVar2->hashctxt2 = (void *)((long)&pHVar2[1].hash + (ulong)hashparams->ctxtsize);
    if (hashparams->maxkeylen < keylen) {
      (*hashparams->hinit)(pHVar3);
      (*hashparams->hupdate)(pHVar2->hashctxt1,local_48,keylen);
      local_48 = (uchar *)((ulong)hashparams->ctxtsize + (long)pHVar2->hashctxt2);
      (*hashparams->hfinal)(local_48,pHVar2->hashctxt1);
      keylen = hashparams->resultlen;
      pHVar3 = (HMAC_context *)pHVar2->hashctxt1;
    }
    (*hashparams->hinit)(pHVar3);
    local_40 = pHVar2;
    (*hashparams->hinit)(pHVar2->hashctxt2);
    puVar1 = local_48;
    uVar4 = (ulong)keylen;
    local_38 = uVar4;
    for (uVar5 = 0; pHVar2 = local_40, uVar4 != uVar5; uVar5 = uVar5 + 1) {
      b = puVar1[uVar5] ^ 0x36;
      (*hashparams->hupdate)(local_40->hashctxt1,&b,1);
      uVar4 = local_38;
      b = puVar1[uVar5] ^ 0x5c;
      (*hashparams->hupdate)(pHVar2->hashctxt2,&b,1);
    }
    for (; uVar4 < hashparams->maxkeylen; uVar4 = uVar4 + 1) {
      (*hashparams->hupdate)(pHVar2->hashctxt1,"6\\",1);
      (*hashparams->hupdate)(pHVar2->hashctxt2,"\\",1);
    }
  }
  return pHVar2;
}

Assistant:

struct HMAC_context *
Curl_HMAC_init(const struct HMAC_params *hashparams,
               const unsigned char *key,
               unsigned int keylen)
{
  size_t i;
  struct HMAC_context *ctxt;
  unsigned char *hkey;
  unsigned char b;

  /* Create HMAC context. */
  i = sizeof(*ctxt) + 2 * hashparams->ctxtsize + hashparams->resultlen;
  ctxt = malloc(i);

  if(!ctxt)
    return ctxt;

  ctxt->hash = hashparams;
  ctxt->hashctxt1 = (void *) (ctxt + 1);
  ctxt->hashctxt2 = (void *) ((char *) ctxt->hashctxt1 + hashparams->ctxtsize);

  /* If the key is too long, replace it by its hash digest. */
  if(keylen > hashparams->maxkeylen) {
    hashparams->hinit(ctxt->hashctxt1);
    hashparams->hupdate(ctxt->hashctxt1, key, keylen);
    hkey = (unsigned char *) ctxt->hashctxt2 + hashparams->ctxtsize;
    hashparams->hfinal(hkey, ctxt->hashctxt1);
    key = hkey;
    keylen = hashparams->resultlen;
  }

  /* Prime the two hash contexts with the modified key. */
  hashparams->hinit(ctxt->hashctxt1);
  hashparams->hinit(ctxt->hashctxt2);

  for(i = 0; i < keylen; i++) {
    b = (unsigned char)(*key ^ hmac_ipad);
    hashparams->hupdate(ctxt->hashctxt1, &b, 1);
    b = (unsigned char)(*key++ ^ hmac_opad);
    hashparams->hupdate(ctxt->hashctxt2, &b, 1);
  }

  for(; i < hashparams->maxkeylen; i++) {
    hashparams->hupdate(ctxt->hashctxt1, &hmac_ipad, 1);
    hashparams->hupdate(ctxt->hashctxt2, &hmac_opad, 1);
  }

  /* Done, return pointer to HMAC context. */
  return ctxt;
}